

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O2

void __thiscall
Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::~PullLowpass
          (PullLowpass<Enterprise::Dave::Audio> *this)

{
  LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::~LowpassBase
            (&this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>)
  ;
  operator_delete(this,0xd8);
  return;
}

Assistant:

PullLowpass(SampleSource &sample_source) : sample_source_(sample_source) {
			// Propagate an initial volume level.
			sample_source.set_sample_volume_range(32767);
		}